

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

int is_same_gf_and_last_scale(AV1_COMMON *cm)

{
  scale_factors *psVar1;
  scale_factors *psVar2;
  scale_factors *sf_golden;
  scale_factors *sf_last;
  MV_REFERENCE_FRAME in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  bool bVar3;
  
  psVar1 = get_ref_scale_factors
                     ((AV1_COMMON *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdf);
  psVar2 = get_ref_scale_factors
                     ((AV1_COMMON *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdf);
  bVar3 = false;
  if (psVar1->x_scale_fp == psVar2->x_scale_fp) {
    bVar3 = psVar1->y_scale_fp == psVar2->y_scale_fp;
  }
  return (int)bVar3;
}

Assistant:

static inline int is_same_gf_and_last_scale(AV1_COMMON *cm) {
  struct scale_factors *const sf_last = get_ref_scale_factors(cm, LAST_FRAME);
  struct scale_factors *const sf_golden =
      get_ref_scale_factors(cm, GOLDEN_FRAME);
  return ((sf_last->x_scale_fp == sf_golden->x_scale_fp) &&
          (sf_last->y_scale_fp == sf_golden->y_scale_fp));
}